

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::TopUpKeyPool(CWallet *this,uint kpSize)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  reference ppSVar4;
  uint in_ESI;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  bool res;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock53;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffff58;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar5;
  byte in_stack_ffffffffffffff6f;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  CWallet *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
  iVar3 = 0x1000000;
  GetActiveScriptPubKeyMans(in_stack_ffffffffffffffd8);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin(in_stack_ffffffffffffff60);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::end(in_stack_ffffffffffffff60);
  while( true ) {
    bVar5 = (byte)((uint)iVar3 >> 0x18);
    bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff6f,
                                              CONCAT16(in_stack_ffffffffffffff6e,
                                                       in_stack_ffffffffffffff68)),
                            (_Self *)in_stack_ffffffffffffff60);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar4 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         in_stack_ffffffffffffff58);
    iVar3 = (*(*ppSVar4)->_vptr_ScriptPubKeyMan[9])(*ppSVar4,(ulong)in_ESI);
    in_stack_ffffffffffffff6f = (byte)iVar3;
    iVar3 = (uint)((bVar5 & 1 & in_stack_ffffffffffffff6f & 1) != 0) << 0x18;
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffff58);
  }
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~set(in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::TopUpKeyPool(unsigned int kpSize)
{
    LOCK(cs_wallet);
    bool res = true;
    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        res &= spk_man->TopUp(kpSize);
    }
    return res;
}